

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

void ma_pcm_s16_to_u8(void *dst,void *src,ma_uint64 count,ma_dither_mode ditherMode)

{
  short sVar1;
  uint uVar2;
  ma_dither_mode ditherMode_local;
  ma_uint64 count_local;
  void *src_local;
  void *dst_local;
  undefined1 uStack_101;
  ma_int32 dither;
  ma_int16 x_1;
  ma_uint64 i_1;
  ulong uStack_f0;
  ma_int16 x;
  ma_uint64 i;
  ma_int16 *src_s16;
  ma_uint8 *dst_u8;
  ma_int32 b;
  ma_int32 a_1;
  ma_int32 a;
  undefined4 local_9c;
  
  if (ditherMode == ma_dither_mode_none) {
    for (uStack_f0 = 0; uStack_f0 < count; uStack_f0 = uStack_f0 + 1) {
      *(char *)((long)dst + uStack_f0) =
           (char)((ushort)*(undefined2 *)((long)src + uStack_f0 * 2) >> 8) + -0x80;
    }
  }
  else {
    for (_dither = 0; _dither < count; _dither = _dither + 1) {
      sVar1 = *(short *)((long)src + _dither * 2);
      if (ditherMode == ma_dither_mode_rectangle) {
        g_maLCG.state = (g_maLCG.state * 0xbc8f) % 0x7fffffff;
        local_9c = (uint)g_maLCG.state / 0x1000000 - 0x80;
      }
      else if (ditherMode == ma_dither_mode_triangle) {
        uVar2 = (g_maLCG.state * 0xbc8f) % 0x7fffffff;
        g_maLCG.state = (int)(uVar2 * 0xbc8f) % 0x7fffffff;
        local_9c = (uVar2 / 0x1fc07f1 - 0x80) + (uint)g_maLCG.state / 0x2000000;
      }
      else {
        local_9c = 0;
      }
      if (sVar1 + local_9c < 0x8000) {
        uStack_101 = (char)((ushort)(sVar1 + (short)local_9c) >> 8);
      }
      else {
        uStack_101 = '\x7f';
      }
      *(char *)((long)dst + _dither) = uStack_101 + -0x80;
    }
  }
  return;
}

Assistant:

MA_API void ma_pcm_s16_to_u8(void* dst, const void* src, ma_uint64 count, ma_dither_mode ditherMode)
{
#ifdef MA_USE_REFERENCE_CONVERSION_APIS
    ma_pcm_s16_to_u8__reference(dst, src, count, ditherMode);
#else
    #  if MA_PREFERRED_SIMD == MA_SIMD_AVX2
        if (ma_has_avx2()) {
            ma_pcm_s16_to_u8__avx2(dst, src, count, ditherMode);
        } else
    #elif MA_PREFERRED_SIMD == MA_SIMD_SSE2
        if (ma_has_sse2()) {
            ma_pcm_s16_to_u8__sse2(dst, src, count, ditherMode);
        } else
    #elif MA_PREFERRED_SIMD == MA_SIMD_NEON
        if (ma_has_neon()) {
            ma_pcm_s16_to_u8__neon(dst, src, count, ditherMode);
        } else
    #endif
        {
            ma_pcm_s16_to_u8__optimized(dst, src, count, ditherMode);
        }
#endif
}